

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegalizeJSInterface.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::LegalizeAndPruneJSInterface::run
          (LegalizeAndPruneJSInterface *this,Module *module)

{
  Module *module_local;
  LegalizeAndPruneJSInterface *this_local;
  
  LegalizeJSInterface::run(&this->super_LegalizeJSInterface,module);
  prune(this,module);
  return;
}

Assistant:

void run(Module* module) override {
    LegalizeJSInterface::run(module);

    prune(module);
  }